

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

void write_utf8(charset_spec *charset,long input_chr,charset_state *state,
               _func_void_void_ptr_long *emit,void *emitctx)

{
  undefined4 uVar1;
  ulong uVar2;
  
  uVar2 = 0xffff;
  if (((input_chr & 0xfffffffffffff800U) != 0xd800 && (input_chr & 0xfffffffffffffffeU) != 0xfffe)
     && (uVar2 = input_chr, 0x7f < input_chr)) {
    if ((ulong)input_chr < 0x800) {
      uVar2 = (ulong)input_chr >> 6 | 0xc0;
    }
    else if ((ulong)input_chr < 0x10000) {
      (*emit)(emitctx,(ulong)input_chr >> 0xc | 0xe0);
      uVar2 = (ulong)((uint)((ulong)input_chr >> 6) & 0x3f) | 0x80;
    }
    else {
      if ((ulong)input_chr < 0x200000) {
        (*emit)(emitctx,(ulong)input_chr >> 0x12 | 0xf0);
        uVar1 = (undefined4)((ulong)input_chr >> 0xc);
      }
      else {
        if ((ulong)input_chr < 0x4000000) {
          (*emit)(emitctx,(ulong)input_chr >> 0x18 | 0xf8);
          uVar1 = (undefined4)((ulong)input_chr >> 0x12);
        }
        else {
          (*emit)(emitctx,(ulong)input_chr >> 0x1e & 1 | 0xfc);
          (*emit)(emitctx,(ulong)((ulong)input_chr >> 0x18) & 0x3f | 0x80);
          uVar1 = (undefined4)((ulong)input_chr >> 0x12);
        }
        (*emit)(emitctx,(ulong)uVar1 & 0x3f | 0x80);
        uVar1 = (undefined4)((ulong)input_chr >> 0xc);
      }
      (*emit)(emitctx,(ulong)uVar1 & 0x3f | 0x80);
      uVar2 = (ulong)((uint)((ulong)input_chr >> 6) & 0x3f) | 0x80;
    }
    (*emit)(emitctx,uVar2);
    uVar2 = (ulong)((uint)input_chr & 0x3f) | 0x80;
  }
  (*emit)(emitctx,uVar2);
  return;
}

Assistant:

static void write_utf8(charset_spec const *charset, long int input_chr,
                       charset_state *state,
                       void (*emit)(void *ctx, long int output), void *emitctx)
{
    UNUSEDARG(charset);
    UNUSEDARG(state);

    /*
     * Refuse to output any illegal code points.
     */
    if (input_chr == 0xFFFE || input_chr == 0xFFFF ||
        (input_chr >= 0xD800 && input_chr < 0xE000)) {
        emit(emitctx, ERROR);
    } else if (input_chr < 0x80) {     /* one-byte character */
        emit(emitctx, input_chr);
    } else if (input_chr < 0x800) {    /* two-byte character */
        emit(emitctx, 0xC0 | (0x1F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x10000) {  /* three-byte character */
        emit(emitctx, 0xE0 | (0x0F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x200000) { /* four-byte character */
        emit(emitctx, 0xF0 | (0x07 & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x4000000) {/* five-byte character */
        emit(emitctx, 0xF8 | (0x03 & (input_chr >> 24)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else {                           /* six-byte character */
        emit(emitctx, 0xFC | (0x01 & (input_chr >> 30)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 24)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    }
}